

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_prediction_scheme_constrained_multi_parallelogram_decoder.h
# Opt level: O0

bool __thiscall
draco::
MeshPredictionSchemeConstrainedMultiParallelogramDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>,_draco::MeshPredictionSchemeData<draco::MeshAttributeCornerTable>_>
::DecodePredictionData
          (MeshPredictionSchemeConstrainedMultiParallelogramDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>,_draco::MeshPredictionSchemeData<draco::MeshAttributeCornerTable>_>
           *this,DecoderBuffer *buffer)

{
  bool bVar1;
  byte bVar2;
  uint16_t uVar3;
  uint uVar4;
  MeshData *this_00;
  DecoderBuffer *in_RSI;
  MeshPredictionSchemeDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>,_draco::MeshPredictionSchemeData<draco::MeshAttributeCornerTable>_>
  *in_RDI;
  reference rVar5;
  undefined1 unaff_retaddr;
  size_type in_stack_00000008;
  vector<bool,_std::allocator<bool>_> *in_stack_00000010;
  uint32_t j;
  RAnsBitDecoder decoder;
  uint32_t num_flags;
  int i;
  uint8_t mode;
  _Bit_type in_stack_ffffffffffffff68;
  _Bit_type *in_stack_ffffffffffffff70;
  undefined7 in_stack_ffffffffffffff78;
  undefined1 in_stack_ffffffffffffff7f;
  DecoderBuffer *source_buffer;
  undefined4 in_stack_ffffffffffffff88;
  uint uVar6;
  reference local_68;
  uint local_54;
  int local_50;
  DecoderBuffer local_40;
  byte local_1;
  
  uVar3 = DecoderBuffer::bitstream_version(in_RSI);
  if (uVar3 < 0x202) {
    bVar1 = DecoderBuffer::Decode<unsigned_char>
                      ((DecoderBuffer *)
                       CONCAT17(in_stack_ffffffffffffff7f,in_stack_ffffffffffffff78),
                       (uchar *)in_stack_ffffffffffffff70);
    if (!bVar1) {
      local_1 = 0;
      goto LAB_001e47ec;
    }
    if (local_40.bit_decoder_.bit_buffer_end_._7_1_ != '\0') {
      local_1 = 0;
      goto LAB_001e47ec;
    }
  }
  rVar5._M_mask = in_stack_ffffffffffffff68;
  rVar5._M_p = in_stack_ffffffffffffff70;
  for (local_40.bit_decoder_.bit_buffer_end_._0_4_ = 0;
      (int)local_40.bit_decoder_.bit_buffer_end_ < 4;
      local_40.bit_decoder_.bit_buffer_end_._0_4_ = (int)local_40.bit_decoder_.bit_buffer_end_ + 1)
  {
    bVar1 = DecodeVarint<unsigned_int>((uint *)rVar5._M_mask,(DecoderBuffer *)0x1e463c);
    if (!bVar1) {
      local_1 = 0;
      goto LAB_001e47ec;
    }
    uVar6 = local_40.bit_decoder_.bit_buffer_._4_4_;
    this_00 = MeshPredictionSchemeDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>,_draco::MeshPredictionSchemeData<draco::MeshAttributeCornerTable>_>
              ::mesh_data(in_RDI);
    MeshPredictionSchemeData<draco::MeshAttributeCornerTable>::corner_table(this_00);
    uVar4 = MeshAttributeCornerTable::num_corners((MeshAttributeCornerTable *)0x1e466f);
    if (uVar4 < uVar6) {
      local_1 = 0;
      goto LAB_001e47ec;
    }
    if (local_40.bit_decoder_.bit_buffer_._4_4_ != 0) {
      std::vector<bool,_std::allocator<bool>_>::resize
                (in_stack_00000010,in_stack_00000008,(bool)unaff_retaddr);
      source_buffer = &local_40;
      RAnsBitDecoder::RAnsBitDecoder((RAnsBitDecoder *)rVar5._M_p);
      bVar1 = RAnsBitDecoder::StartDecoding
                        ((RAnsBitDecoder *)CONCAT44(uVar6,in_stack_ffffffffffffff88),source_buffer);
      in_stack_ffffffffffffff88 = CONCAT13(bVar1,(int3)in_stack_ffffffffffffff88);
      if (bVar1) {
        for (local_54 = 0; local_54 < local_40.bit_decoder_.bit_buffer_._4_4_;
            local_54 = local_54 + 1) {
          bVar2 = RAnsBitDecoder::DecodeNextBit((RAnsBitDecoder *)rVar5._M_p);
          rVar5 = std::vector<bool,_std::allocator<bool>_>::operator[]
                            ((vector<bool,_std::allocator<bool>_> *)in_RDI,
                             CONCAT44(uVar6,in_stack_ffffffffffffff88));
          local_68 = rVar5;
          std::_Bit_reference::operator=(&local_68,(bool)(bVar2 & 1));
        }
        RAnsBitDecoder::EndDecoding((RAnsBitDecoder *)&local_40);
        local_50 = 0;
      }
      else {
        local_1 = 0;
        local_50 = 1;
      }
      RAnsBitDecoder::~RAnsBitDecoder((RAnsBitDecoder *)0x1e47b1);
      if (local_50 != 0) goto LAB_001e47ec;
    }
  }
  local_1 = PredictionSchemeDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>_>::
            DecodePredictionData
                      ((PredictionSchemeDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>_>
                        *)rVar5._M_mask,(DecoderBuffer *)0x1e47e3);
LAB_001e47ec:
  return (bool)(local_1 & 1);
}

Assistant:

bool MeshPredictionSchemeConstrainedMultiParallelogramDecoder<
    DataTypeT, TransformT, MeshDataT>::DecodePredictionData(DecoderBuffer
                                                                *buffer) {
#ifdef DRACO_BACKWARDS_COMPATIBILITY_SUPPORTED
  if (buffer->bitstream_version() < DRACO_BITSTREAM_VERSION(2, 2)) {
    // Decode prediction mode.
    uint8_t mode;
    if (!buffer->Decode(&mode)) {
      return false;
    }

    if (mode != Mode::OPTIMAL_MULTI_PARALLELOGRAM) {
      // Unsupported mode.
      return false;
    }
  }
#endif

  // Encode selected edges using separate rans bit coder for each context.
  for (int i = 0; i < kMaxNumParallelograms; ++i) {
    uint32_t num_flags;
    if (!DecodeVarint<uint32_t>(&num_flags, buffer)) {
      return false;
    }
    if (num_flags > this->mesh_data().corner_table()->num_corners()) {
      return false;
    }
    if (num_flags > 0) {
      is_crease_edge_[i].resize(num_flags);
      RAnsBitDecoder decoder;
      if (!decoder.StartDecoding(buffer)) {
        return false;
      }
      for (uint32_t j = 0; j < num_flags; ++j) {
        is_crease_edge_[i][j] = decoder.DecodeNextBit();
      }
      decoder.EndDecoding();
    }
  }
  return MeshPredictionSchemeDecoder<DataTypeT, TransformT,
                                     MeshDataT>::DecodePredictionData(buffer);
}